

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_rc_mode,int>::
IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>::AdvanceIfEnd<1ul>
          (IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<libaom_test::TestMode>::operator!=
                    ((ParamIterator<libaom_test::TestMode> *)(this + 0x60),
                     (ParamIterator<libaom_test::TestMode> *)(this + 0x40));
  if (bVar1) {
    return;
  }
  ParamIterator<libaom_test::TestMode>::operator=
            ((ParamIterator<libaom_test::TestMode> *)(this + 0x60),
             (ParamIterator<libaom_test::TestMode> *)(this + 0x20));
  (**(code **)(**(long **)(this + 0x68) + 0x18))();
  AdvanceIfEnd<0ul>(this);
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }